

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation_capi.cpp
# Opt level: O2

LOTMarkerList * lottie_animation_get_markerlist(Lottie_Animation_S *animation)

{
  undefined1 auVar1 [16];
  pointer ptVar2;
  MarkerList *__x;
  ulong uVar3;
  LOTMarkerList *pLVar4;
  LOTMarker *__s;
  char *pcVar5;
  ulong __n;
  size_t *psVar6;
  bool bVar7;
  MarkerList markers;
  
  if (animation == (Lottie_Animation_S *)0x0) {
    pLVar4 = (LOTMarkerList *)0x0;
  }
  else {
    __x = rlottie::Animation::markers_abi_cxx11_
                    ((animation->mAnimation)._M_t.
                     super___uniq_ptr_impl<rlottie::Animation,_std::default_delete<rlottie::Animation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_rlottie::Animation_*,_std::default_delete<rlottie::Animation>_>
                     .super__Head_base<0UL,_rlottie::Animation_*,_false>._M_head_impl);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::vector(&markers,__x);
    uVar3 = ((long)markers.
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)markers.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    if (markers.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        markers.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pLVar4 = (LOTMarkerList *)0x0;
    }
    else {
      pLVar4 = animation->mMarkerList;
      if (pLVar4 == (LOTMarkerList *)0x0) {
        pLVar4 = (LOTMarkerList *)operator_new(0x10);
        animation->mMarkerList = pLVar4;
        pLVar4->size = uVar3;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        __n = 0xffffffffffffffff;
        if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
          __n = SUB168(auVar1 * ZEXT816(0x18),0);
        }
        __s = (LOTMarker *)operator_new__(__n);
        memset(__s,0,__n);
        pLVar4->ptr = __s;
        psVar6 = &__s->endframe;
        ptVar2 = markers.
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
          pcVar5 = strdup((ptVar2->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                          ).
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p);
          ((LOTMarker *)(psVar6 + -2))->name = pcVar5;
          psVar6[-1] = (long)(ptVar2->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                             ).super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                             _M_head_impl;
          *psVar6 = (long)(ptVar2->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                          ).super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                          super__Head_base<2UL,_int,_false>._M_head_impl;
          ptVar2 = ptVar2 + 1;
          psVar6 = psVar6 + 3;
        }
      }
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::~vector(&markers);
  }
  return pLVar4;
}

Assistant:

RLOTTIE_API const LOTMarkerList*
lottie_animation_get_markerlist(Lottie_Animation_S *animation)
{
   if (!animation) return nullptr;

   auto markers = animation->mAnimation->markers();
   if (markers.size() == 0) return nullptr;
   if (animation->mMarkerList) return (const LOTMarkerList*)animation->mMarkerList;

   animation->mMarkerList = new LOTMarkerList();
   animation->mMarkerList->size = markers.size();
   animation->mMarkerList->ptr = new LOTMarker[markers.size()]();

   for(size_t i = 0; i < markers.size(); i++) {
       animation->mMarkerList->ptr[i].name = strdup(std::get<0>(markers[i]).c_str());
       animation->mMarkerList->ptr[i].startframe= std::get<1>(markers[i]);
       animation->mMarkerList->ptr[i].endframe= std::get<2>(markers[i]);
   }
   return (const LOTMarkerList*)animation->mMarkerList;
}